

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall
ExprTest_EqualBinaryLogicalExpr_Test::TestBody(ExprTest_EqualBinaryLogicalExpr_Test *this)

{
  ExprFactory *this_00;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> lhs;
  bool bVar1;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  BVar2;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  BVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  
  this_00 = &(this->super_ExprTest).factory_;
  BVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l0.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l1.super_ExprBase.impl_);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l0.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l1.super_ExprBase.impl_);
  local_48[0] = (internal)
                mp::Equal((Expr)BVar2.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.
                                super_ExprBase.impl_,
                          (Expr)BVar3.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.
                                super_ExprBase.impl_);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,
               (AssertionResult *)
               "Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1), factory_.MakeBinaryLogical(expr::OR, l0, l1))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x363
               ,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l0.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l1.super_ExprBase.impl_);
  lhs.super_ExprBase.impl_ = (ExprBase)(this->super_ExprTest).l0.super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,lhs,lhs)
  ;
  bVar1 = mp::Equal((Expr)BVar2.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.
                          super_ExprBase.impl_,
                    (Expr)BVar3.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.
                          super_ExprBase.impl_);
  local_48[0] = (internal)!bVar1;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48[0]) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,
               (AssertionResult *)
               "Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1), factory_.MakeBinaryLogical(expr::OR, l0, l0))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x365
               ,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, EqualBinaryLogicalExpr) {
  EXPECT_TRUE(Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1),
                    factory_.MakeBinaryLogical(expr::OR, l0, l1)));
  EXPECT_FALSE(Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1),
                     factory_.MakeBinaryLogical(expr::OR, l0, l0)));
}